

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticlePairs.test.cpp
# Opt level: O3

string * zeroNumberParticlePair_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          0          1         24          0262532151     \n 0.000000+0 5.446635+1 2.000000+0 2.600000+1 1.000000+0 4.000000+0262532151     \n 6.000000+0 8.000000+0 1.000000+1 1.020000+2 1.200000+1 1.400000+1262532151     \n 1.000000+0 5.347624+1 3.000000+0 2.700000+1 5.000000-1 5.000000+0262532151     \n 7.000000+0 9.000000+0 1.100000+1 2.000000+0 1.300000+1 1.500000+1262532151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string zeroNumberParticlePair() {
  return
    " 0.000000+0 0.000000+0          0          1         24          0262532151     \n"
    " 0.000000+0 5.446635+1 2.000000+0 2.600000+1 1.000000+0 4.000000+0262532151     \n"
    " 6.000000+0 8.000000+0 1.000000+1 1.020000+2 1.200000+1 1.400000+1262532151     \n"
    " 1.000000+0 5.347624+1 3.000000+0 2.700000+1 5.000000-1 5.000000+0262532151     \n"
    " 7.000000+0 9.000000+0 1.100000+1 2.000000+0 1.300000+1 1.500000+1262532151     \n";
}